

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void run_test<unsigned_long>(void)

{
  char *pcVar1;
  DivideTest<unsigned_long> dt;
  char msg [64];
  DivideTest<unsigned_long> *this;
  DivideTest<unsigned_long> local_48 [4];
  
  this = local_48;
  pcVar1 = type_name<unsigned_long>::get_name();
  snprintf((char *)this,0x40,"Testing %s\n",pcVar1);
  std::operator<<((ostream *)&std::cout,(char *)local_48);
  DivideTest<unsigned_long>::DivideTest(this);
  DivideTest<unsigned_long>::run((DivideTest<unsigned_long> *)dt._0_8_);
  return;
}

Assistant:

void run_test() {
    char msg[64];
    snprintf(msg, sizeof(msg), "Testing %s\n", type_name<T>::get_name());
    PRINT_INFO(msg);
    DivideTest<T> dt;
    dt.run();
}